

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_vector.hpp
# Opt level: O0

void __thiscall
poplar::compact_vector::compact_vector(compact_vector *this,uint64_t size,uint32_t width)

{
  sbyte sVar1;
  undefined8 uVar2;
  uint in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  char *in_stack_ffffffffffffff98;
  exception *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffc8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffd0;
  byte local_14;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1964c1);
  *(undefined8 *)(in_RDI + 0x18) = 0;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  if (0x3f < in_EDX) {
    uVar2 = __cxa_allocate_exception(0x10);
    exception::exception(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    __cxa_throw(uVar2,&exception::typeinfo,exception::~exception);
  }
  *(undefined8 *)(in_RDI + 0x18) = in_RSI;
  local_14 = (byte)in_EDX;
  sVar1 = (local_14 < 0x41) * ('@' - local_14);
  *(ulong *)(in_RDI + 0x20) = (ulong)(-1L << sVar1) >> sVar1;
  *(ulong *)(in_RDI + 0x28) = (ulong)in_EDX;
  bit_tools::words_for<unsigned_long>(*(long *)(in_RDI + 0x18) * *(long *)(in_RDI + 0x28));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(value_type *)0x0);
  return;
}

Assistant:

compact_vector(uint64_t size, uint32_t width) {
        POPLAR_THROW_IF(64 <= width, "width overflow.");

        size_ = size;
        mask_ = (1ULL << width) - 1;
        width_ = width;
        chunks_.resize(bit_tools::words_for(size_ * width_), 0);
    }